

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void Js::DynamicProfileInfo::DumpProfiledValue
               (char16 *name,ArrayCallSiteInfo *arrayCallSiteInfo,uint count)

{
  char16_t *form;
  uint local_20;
  uint i;
  uint count_local;
  ArrayCallSiteInfo *arrayCallSiteInfo_local;
  char16 *name_local;
  
  if (count != 0) {
    Output::Print(L"    %-16s(%2d):",name,(ulong)count);
    Output::Print(L"\n");
    for (local_20 = 0; local_20 < count; local_20 = local_20 + 1) {
      form = L" ";
      if (local_20 != 0 && local_20 % 10 == 0) {
        form = L"\n                          ";
      }
      Output::Print(form);
      Output::Print(L"%4d:",(ulong)local_20);
      Output::Print(L"  Function Number:  %2d, CallSite Number:  %2d, IsNativeIntArray:  %2d, IsNativeFloatArray:  %2d"
                    ,(ulong)arrayCallSiteInfo[local_20].functionNumber,
                    (ulong)arrayCallSiteInfo[local_20].callSiteNumber,
                    (ulong)(((arrayCallSiteInfo[local_20].field_0.bits & 1) != 0 ^ 0xffU) & 1),
                    (ulong)(((arrayCallSiteInfo[local_20].field_0.bits >> 1 & 1) != 0 ^ 0xffU) & 1))
      ;
      Output::Print(L"\n");
    }
    Output::Print(L"\n");
  }
  return;
}

Assistant:

void DynamicProfileInfo::DumpProfiledValue(char16 const * name, ArrayCallSiteInfo * arrayCallSiteInfo, uint count)
    {
        if (count != 0)
        {
            Output::Print(_u("    %-16s(%2d):"), name, count);
            Output::Print(_u("\n"));
            for (uint i = 0; i < count; i++)
            {
                Output::Print(i != 0 && (i % 10) == 0 ? _u("\n                          ") : _u(" "));
                Output::Print(_u("%4d:"), i);
                Output::Print(_u("  Function Number:  %2d, CallSite Number:  %2d, IsNativeIntArray:  %2d, IsNativeFloatArray:  %2d"),
                    arrayCallSiteInfo[i].functionNumber, arrayCallSiteInfo[i].callSiteNumber, !arrayCallSiteInfo[i].isNotNativeInt, !arrayCallSiteInfo[i].isNotNativeFloat);
                Output::Print(_u("\n"));
            }
            Output::Print(_u("\n"));
        }
    }